

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O2

void Assimp::DeleteImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *deleteList)

{
  pointer ppBVar1;
  size_t i;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppBVar1 = (deleteList->
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(deleteList->
                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar2)
    break;
    if (ppBVar1[uVar2] != (BaseImporter *)0x0) {
      (*ppBVar1[uVar2]->_vptr_BaseImporter[2])();
      ppBVar1 = (deleteList->
                super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
    }
    ppBVar1[uVar2] = (BaseImporter *)0x0;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void DeleteImporterInstanceList(std::vector< BaseImporter* >& deleteList){
	for(size_t i= 0; i<deleteList.size();++i){
		delete deleteList[i];
		deleteList[i]=nullptr;
	}//for
}